

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agentf.c
# Opt level: O0

void agentf_send_eof(Channel *chan)

{
  agentf *af;
  Channel *chan_local;
  
  if (chan->vt == &agentf_channelvt) {
    *(undefined1 *)((long)&chan[-1].initial_fixed_window_size + 1) = 1;
    agentf_try_forward((agentf *)(chan + -4));
    return;
  }
  __assert_fail("chan->vt == &agentf_channelvt",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/agentf.c",
                0xdc,"void agentf_send_eof(Channel *)");
}

Assistant:

static void agentf_send_eof(Channel *chan)
{
    assert(chan->vt == &agentf_channelvt);
    agentf *af = container_of(chan, agentf, chan);

    af->rcvd_eof = true;

    /* Call try_forward, which will respond to the EOF now if
     * appropriate, or wait until the queue of outstanding requests is
     * dealt with if not. */
    agentf_try_forward(af);
}